

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void mg_vsnprintf(mg_connection *conn,int *truncated,char *buf,size_t buflen,char *fmt,
                 __va_list_tag *ap)

{
  ulong local_58;
  int local_3c;
  int ok;
  int n;
  __va_list_tag *ap_local;
  char *fmt_local;
  size_t buflen_local;
  char *buf_local;
  int *truncated_local;
  mg_connection *conn_local;
  
  if (buflen == 0) {
    if (truncated != (int *)0x0) {
      *truncated = 1;
    }
  }
  else {
    local_3c = vsnprintf(buf,buflen,fmt,ap);
    if (local_3c < 0 || buflen <= (ulong)(long)local_3c) {
      if (truncated != (int *)0x0) {
        *truncated = 1;
      }
      if (buflen < 0xc9) {
        local_58 = buflen - 1;
      }
      else {
        local_58 = 200;
      }
      mg_cry_internal_wrap
                (conn,(mg_context *)0x0,"mg_vsnprintf",0xc3f,"truncating vsnprintf buffer: [%.*s]",
                 local_58 & 0xffffffff,buf);
      local_3c = (int)buflen + -1;
    }
    else if (truncated != (int *)0x0) {
      *truncated = 0;
    }
    buf[local_3c] = '\0';
  }
  return;
}

Assistant:

static void
mg_vsnprintf(const struct mg_connection *conn,
             int *truncated,
             char *buf,
             size_t buflen,
             const char *fmt,
             va_list ap)
{
	int n, ok;

	if (buflen == 0) {
		if (truncated) {
			*truncated = 1;
		}
		return;
	}

#if defined(__clang__)
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
	/* Using fmt as a non-literal is intended here, since it is mostly called
	 * indirectly by mg_snprintf */
#endif

	n = (int)vsnprintf_impl(buf, buflen, fmt, ap);
	ok = (n >= 0) && ((size_t)n < buflen);

#if defined(__clang__)
#pragma clang diagnostic pop
#endif

	if (ok) {
		if (truncated) {
			*truncated = 0;
		}
	} else {
		if (truncated) {
			*truncated = 1;
		}
		mg_cry_internal(conn,
		                "truncating vsnprintf buffer: [%.*s]",
		                (int)((buflen > 200) ? 200 : (buflen - 1)),
		                buf);
		n = (int)buflen - 1;
	}
	buf[n] = '\0';
}